

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testserverconnector.hpp
# Opt level: O3

json __thiscall
TestServerConnector::VerifyMethodResult(TestServerConnector *this,json *id,json *result)

{
  code *pcVar1;
  double dVar2;
  undefined8 uVar3;
  bool bVar4;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  reference other;
  json_value extraout_RDX;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 uVar6;
  json jVar7;
  const_iterator result_2;
  ResultBuilder DOCTEST_RB;
  const_iterator result_1;
  const_iterator local_190;
  ExpressionDecomposer local_16c;
  undefined1 local_168 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  Result local_128;
  ResultBuilder local_108;
  ulong local_78;
  const_iterator local_70;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_50;
  
  doctest::String::String((String *)&local_190,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_108,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x19,"!has_key(result, \"error\")","",(String *)&local_190);
  doctest::String::~String((String *)&local_190);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&local_148,DT_REQUIRE);
  local_168._0_8_ = &aStack_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"error","");
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::find<std::__cxx11::string_const&>
            (&local_70,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)result,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
  local_50.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_50.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_50.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_50.m_object = result;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_end(&local_50);
  bVar4 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::
          operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                    (&local_70,&local_50);
  local_128._0_8_ = (ulong)bVar4 | (long)local_148._M_dataplus._M_p << 0x20;
  doctest::detail::Expression_lhs::operator_cast_to_Result
            ((Result *)&local_190,(Expression_lhs *)&local_128);
  doctest::detail::ResultBuilder::setResult(&local_108,(Result *)&local_190);
  doctest::String::~String((String *)&local_190.m_it);
  uVar5 = extraout_XMM0_Da;
  uVar6 = extraout_XMM0_Db;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._0_8_ != &aStack_158) {
    operator_delete((void *)local_168._0_8_,aStack_158._M_allocated_capacity + 1);
    uVar5 = extraout_XMM0_Da_00;
    uVar6 = extraout_XMM0_Db_00;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_108,(double)CONCAT44(uVar6,uVar5));
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    jVar7 = (json)(*pcVar1)(SUB84(dVar2,0));
    return jVar7;
  }
  doctest::detail::ResultBuilder::react(&local_108);
  doctest::String::~String((String *)&local_108.super_AssertData.m_exception_string);
  doctest::String::~String(&local_108.super_AssertData.m_decomp);
  doctest::String::~String(&local_108.super_AssertData.m_exception);
  doctest::String::String((String *)&local_190,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_108,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x1a,"result[\"jsonrpc\"] == \"2.0\"","",(String *)&local_190);
  doctest::String::~String((String *)&local_190);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&local_128,DT_REQUIRE);
  local_168._0_8_ =
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::operator[]<char_const>
                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   *)result,"jsonrpc");
  local_168._8_4_ = local_128._0_4_;
  doctest::detail::
  Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
  ::operator==((Result *)&local_190,
               (Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
                *)local_168,(char (*) [4])"2.0");
  doctest::detail::ResultBuilder::setResult(&local_108,(Result *)&local_190);
  doctest::String::~String((String *)&local_190.m_it);
  dVar2 = doctest::detail::ResultBuilder::log
                    (&local_108,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
  if (extraout_AL_00 != '\0') {
    pcVar1 = (code *)swi(3);
    jVar7 = (json)(*pcVar1)(SUB84(dVar2,0));
    return jVar7;
  }
  doctest::detail::ResultBuilder::react(&local_108);
  doctest::String::~String((String *)&local_108.super_AssertData.m_exception_string);
  doctest::String::~String(&local_108.super_AssertData.m_decomp);
  doctest::String::~String(&local_108.super_AssertData.m_exception);
  doctest::String::String((String *)&local_190,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_108,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x1b,"result[\"id\"] == id","",(String *)&local_190);
  doctest::String::~String((String *)&local_190);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&local_128,DT_REQUIRE);
  local_168._0_8_ =
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::operator[]<char_const>
                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   *)result,"id");
  uVar3 = local_128._0_8_;
  local_168[8] = local_128.m_passed;
  local_168._9_3_ = local_128._1_3_;
  local_128._0_8_ = uVar3;
  doctest::detail::
  Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
  ::operator==((Result *)&local_190,
               (Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
                *)local_168,id);
  doctest::detail::ResultBuilder::setResult(&local_108,(Result *)&local_190);
  doctest::String::~String((String *)&local_190.m_it);
  dVar2 = doctest::detail::ResultBuilder::log
                    (&local_108,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
  if (extraout_AL_01 != '\0') {
    pcVar1 = (code *)swi(3);
    jVar7 = (json)(*pcVar1)(SUB84(dVar2,0));
    return jVar7;
  }
  doctest::detail::ResultBuilder::react(&local_108);
  doctest::String::~String((String *)&local_108.super_AssertData.m_exception_string);
  doctest::String::~String(&local_108.super_AssertData.m_decomp);
  doctest::String::~String(&local_108.super_AssertData.m_exception);
  doctest::String::String((String *)&local_190,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_108,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x1c,"has_key(result, \"result\")","",(String *)&local_190);
  doctest::String::~String((String *)&local_190);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_16c,DT_REQUIRE);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"result","");
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::find<std::__cxx11::string_const&>
            (&local_190,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)result,&local_148);
  local_168._8_8_ = (_Base_ptr)0x0;
  aStack_158._M_allocated_capacity = 0;
  aStack_158._8_8_ = 0x8000000000000000;
  local_168._0_8_ = result;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_end((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)local_168);
  bVar4 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::
          operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                    (&local_190,
                     (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)local_168);
  local_78 = (ulong)!bVar4 | (ulong)local_16c.m_at << 0x20;
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_128,(Expression_lhs *)&local_78);
  doctest::detail::ResultBuilder::setResult(&local_108,&local_128);
  doctest::String::~String(&local_128.m_decomp);
  uVar5 = extraout_XMM0_Da_03;
  uVar6 = extraout_XMM0_Db_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    uVar5 = extraout_XMM0_Da_04;
    uVar6 = extraout_XMM0_Db_04;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_108,(double)CONCAT44(uVar6,uVar5));
  if (extraout_AL_02 != '\0') {
    pcVar1 = (code *)swi(3);
    jVar7 = (json)(*pcVar1)(SUB84(dVar2,0));
    return jVar7;
  }
  doctest::detail::ResultBuilder::react(&local_108);
  doctest::String::~String((String *)&local_108.super_AssertData.m_exception_string);
  doctest::String::~String(&local_108.super_AssertData.m_decomp);
  doctest::String::~String(&local_108.super_AssertData.m_exception);
  other = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::operator[]<char_const>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)result,"result");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)this,other);
  jVar7.m_value.object = extraout_RDX.object;
  jVar7._0_8_ = this;
  return jVar7;
}

Assistant:

static json VerifyMethodResult(const json &id, json &result) {
        REQUIRE(!has_key(result, "error"));
        REQUIRE(result["jsonrpc"] == "2.0");
        REQUIRE(result["id"] == id);
        REQUIRE(has_key(result, "result"));
        return result["result"];
    }